

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::TextureLevel::TextureLevel
          (TextureLevel *this,TextureFormat *format,int width,int height,int depth)

{
  int depth_local;
  int height_local;
  int width_local;
  TextureFormat *format_local;
  TextureLevel *this_local;
  
  this->m_format = *format;
  Vector<int,_3>::Vector(&this->m_size,0);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::ArrayBuffer(&this->m_data);
  setSize(this,width,height,depth);
  return;
}

Assistant:

TextureLevel::TextureLevel (const TextureFormat& format, int width, int height, int depth)
	: m_format	(format)
	, m_size	(0)
{
	setSize(width, height, depth);
}